

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmarkdowntextedit.cpp
# Opt level: O0

bool __thiscall QMarkdownTextEdit::handleReturnEntered(QMarkdownTextEdit *this)

{
  byte bVar1;
  bool bVar2;
  MoveMode MVar3;
  uint uVar4;
  ulong uVar5;
  qsizetype qVar6;
  bool local_4bb;
  QString local_450;
  undefined1 local_438 [8];
  QString whitespaces_2;
  QRegularExpressionMatch match_3;
  QFlags<QRegularExpression::MatchOption> local_414;
  QRegularExpressionMatchIterator local_410 [12];
  QFlags<QRegularExpression::PatternOption> local_404;
  QString local_400;
  QRegularExpression local_3e8;
  QString local_3e0;
  QString local_3c8;
  QString local_3b0;
  QString local_398;
  QString local_380;
  undefined1 local_368 [8];
  QString whitespaceCharacter_1;
  QString listMarker;
  undefined1 local_318 [4];
  uint listNumber;
  QString whitespaces_1;
  QRegularExpressionMatch match_2;
  QFlags<QRegularExpression::MatchOption> local_2f4;
  QRegularExpressionMatchIterator local_2f0 [12];
  QFlags<QRegularExpression::PatternOption> local_2e4;
  QString local_2e0;
  QRegularExpression local_2c8;
  QString local_2c0;
  QString local_2a8;
  QString local_290;
  QArrayDataPointer<char16_t> local_278;
  QString local_260;
  QString local_248;
  undefined1 local_230 [8];
  QString realListCharacter;
  QRegularExpressionMatch match_1;
  QFlags<QRegularExpression::PatternOption> local_20c;
  QString local_208;
  QRegularExpression local_1f0;
  QRegularExpressionMatchIterator local_1e8 [8];
  undefined1 local_1e0 [8];
  QString whitespaceCharacter;
  QString listCharacter;
  QString whitespaces;
  QRegularExpressionMatch match;
  QFlags<QRegularExpression::MatchOption> local_18c;
  QRegularExpressionMatchIterator local_188 [12];
  QFlags<QRegularExpression::PatternOption> local_17c;
  QString local_178;
  QRegularExpression local_160;
  QLatin1Char local_151;
  QChar local_150;
  QChar local_14e;
  QLatin1Char local_14b;
  QChar local_14a;
  QChar local_148;
  QLatin1Char local_145;
  QChar local_144;
  QChar local_142;
  QLatin1Char local_13f;
  QChar local_13e;
  QChar local_13c;
  bool local_139;
  char16_t local_138;
  char16_t local_136;
  QChar local_134;
  QChar QStack_132;
  bool inList;
  undefined1 local_130 [4];
  QChar char1;
  QChar char0;
  QString currentLine;
  QMessageLogger local_100;
  QDebug local_e0;
  QFlags<QRegularExpression::MatchOption> local_d4;
  QRegularExpressionMatchIterator local_d0 [12];
  QFlags<QRegularExpression::PatternOption> local_c4;
  QString local_c0;
  QRegularExpression local_a8;
  undefined4 local_a0;
  QFlags<QRegularExpression::MatchOption> local_9c;
  QRegularExpressionMatchIterator local_98 [8];
  QRegularExpressionMatchIterator iterator;
  QFlags<QRegularExpression::PatternOption> local_8c;
  QString local_88;
  QRegularExpression local_70;
  QRegularExpression regex;
  QString currentLineText;
  QTextCursor local_38 [4];
  int position;
  QTextCursor cursor;
  QMarkdownTextEdit *this_local;
  char16_t *str;
  
  _cursor = this;
  uVar5 = QPlainTextEdit::isReadOnly();
  if ((uVar5 & 1) != 0) {
    return true;
  }
  QPlainTextEdit::textCursor();
  MVar3 = QTextCursor::position();
  QTextCursor::movePosition((MoveOperation)local_38,4,1);
  QTextCursor::selectedText();
  QString::QString(&local_88,"^(\\s*)([+|\\-|\\*] \\[(x| |)\\]|[+\\-\\*])(\\s+)$");
  QFlags<QRegularExpression::PatternOption>::QFlags(&local_8c,NoPatternOption);
  QRegularExpression::QRegularExpression
            (&local_70,(QString *)&local_88,(QFlags_conflict1 *)(ulong)local_8c.i);
  QString::~QString(&local_88);
  QFlags<QRegularExpression::MatchOption>::QFlags(&local_9c,NoMatchOption);
  QRegularExpression::globalMatch
            ((QString *)local_98,(longlong)&local_70,(MatchType)&regex,(QFlags_conflict1 *)0x0);
  bVar1 = QRegularExpressionMatchIterator::hasNext();
  if ((bVar1 & 1) != 0) {
    QTextCursor::removeSelectedText();
    this_local._7_1_ = true;
    local_a0 = 1;
    goto LAB_00116f42;
  }
  QString::QString(&local_c0,"^(\\s*)(\\d+[\\.|\\)])(\\s+)$");
  QFlags<QRegularExpression::PatternOption>::QFlags(&local_c4,NoPatternOption);
  QRegularExpression::QRegularExpression
            (&local_a8,(QString *)&local_c0,(QFlags_conflict1 *)(ulong)local_c4.i);
  QRegularExpression::operator=(&local_70,&local_a8);
  QRegularExpression::~QRegularExpression(&local_a8);
  QString::~QString(&local_c0);
  QFlags<QRegularExpression::MatchOption>::QFlags(&local_d4,NoMatchOption);
  QRegularExpression::globalMatch
            ((QString *)local_d0,(longlong)&local_70,(MatchType)&regex,(QFlags_conflict1 *)0x0);
  QRegularExpressionMatchIterator::operator=(local_98,local_d0);
  QRegularExpressionMatchIterator::~QRegularExpressionMatchIterator(local_d0);
  bVar1 = QRegularExpressionMatchIterator::hasNext();
  if ((bVar1 & 1) != 0) {
    QMessageLogger::QMessageLogger(&local_100,(char *)0x0,0,(char *)0x0);
    QMessageLogger::debug();
    QTextCursor::selectedText();
    QDebug::operator<<(&local_e0,(QString *)&currentLine.d.size);
    QString::~QString((QString *)&currentLine.d.size);
    QDebug::~QDebug(&local_e0);
    QTextCursor::removeSelectedText();
    this_local._7_1_ = true;
    local_a0 = 1;
    goto LAB_00116f42;
  }
  QString::trimmed((QString *)local_130,(QString *)&regex);
  QChar::QChar(&stack0xfffffffffffffece);
  QChar::QChar(&local_134);
  qVar6 = QString::length((QString *)local_130);
  if (0 < qVar6) {
    local_136 = (char16_t)QString::at((QString *)local_130,0);
    QStack_132 = (QChar)local_136;
  }
  qVar6 = QString::length((QString *)local_130);
  if (1 < qVar6) {
    local_138 = (char16_t)QString::at((QString *)local_130,1);
    local_134 = (QChar)local_138;
  }
  local_13c.ucs = QStack_132.ucs;
  QLatin1Char::QLatin1Char(&local_13f,'*');
  QChar::QChar(&local_13e,local_13f);
  bVar2 = ::operator==(local_13c,local_13e);
  if (bVar2) {
LAB_001162db:
    local_14e.ucs = local_134.ucs;
    QLatin1Char::QLatin1Char(&local_151,' ');
    QChar::QChar(&local_150,local_151);
    local_4bb = ::operator==(local_14e,local_150);
  }
  else {
    local_142.ucs = QStack_132.ucs;
    QLatin1Char::QLatin1Char(&local_145,'-');
    QChar::QChar(&local_144,local_145);
    bVar2 = ::operator==(local_142,local_144);
    if (bVar2) goto LAB_001162db;
    local_148.ucs = QStack_132.ucs;
    QLatin1Char::QLatin1Char(&local_14b,'+');
    QChar::QChar(&local_14a,local_14b);
    bVar2 = ::operator==(local_148,local_14a);
    local_4bb = false;
    if (bVar2) goto LAB_001162db;
  }
  local_139 = local_4bb;
  if (local_4bb == false) {
LAB_001168de:
    QString::QString(&local_2e0,"^(\\s*)(\\d+)([\\.|\\)])(\\s+)");
    QFlags<QRegularExpression::PatternOption>::QFlags(&local_2e4,NoPatternOption);
    QRegularExpression::QRegularExpression
              (&local_2c8,(QString *)&local_2e0,(QFlags_conflict1 *)(ulong)local_2e4.i);
    QRegularExpression::operator=(&local_70,&local_2c8);
    QRegularExpression::~QRegularExpression(&local_2c8);
    QString::~QString(&local_2e0);
    QFlags<QRegularExpression::MatchOption>::QFlags(&local_2f4,NoMatchOption);
    QRegularExpression::globalMatch
              ((QString *)local_2f0,(longlong)&local_70,(MatchType)&regex,(QFlags_conflict1 *)0x0);
    QRegularExpressionMatchIterator::operator=(local_98,local_2f0);
    QRegularExpressionMatchIterator::~QRegularExpressionMatchIterator(local_2f0);
    bVar1 = QRegularExpressionMatchIterator::hasNext();
    if ((bVar1 & 1) == 0) {
      QString::QString(&local_400,"^(\\s+)");
      QFlags<QRegularExpression::PatternOption>::QFlags(&local_404,NoPatternOption);
      QRegularExpression::QRegularExpression
                (&local_3e8,(QString *)&local_400,(QFlags_conflict1 *)(ulong)local_404.i);
      QRegularExpression::operator=(&local_70,&local_3e8);
      QRegularExpression::~QRegularExpression(&local_3e8);
      QString::~QString(&local_400);
      QFlags<QRegularExpression::MatchOption>::QFlags(&local_414,NoMatchOption);
      QRegularExpression::globalMatch
                ((QString *)local_410,(longlong)&local_70,(MatchType)&regex,(QFlags_conflict1 *)0x0)
      ;
      QRegularExpressionMatchIterator::operator=(local_98,local_410);
      QRegularExpressionMatchIterator::~QRegularExpressionMatchIterator(local_410);
      bVar1 = QRegularExpressionMatchIterator::hasNext();
      if ((bVar1 & 1) == 0) {
        this_local._7_1_ = false;
        local_a0 = 1;
      }
      else {
        QRegularExpressionMatchIterator::next();
        QRegularExpressionMatch::captured((int)local_438);
        QTextCursor::setPosition((int)local_38,MVar3);
        operator+(&local_450,"\n",(QString *)local_438);
        QTextCursor::insertText((QString *)local_38);
        QString::~QString(&local_450);
        QPlainTextEdit::ensureCursorVisible();
        this_local._7_1_ = true;
        local_a0 = 1;
        QString::~QString((QString *)local_438);
        QRegularExpressionMatch::~QRegularExpressionMatch
                  ((QRegularExpressionMatch *)&whitespaces_2.d.size);
      }
    }
    else {
      QRegularExpressionMatchIterator::next();
      QRegularExpressionMatch::captured((int)local_318);
      QRegularExpressionMatch::captured((int)&listMarker + 0x10);
      uVar4 = QString::toUInt((QString *)&listMarker.d.size,(bool *)0x0,10);
      QString::~QString((QString *)&listMarker.d.size);
      QRegularExpressionMatch::captured((int)&whitespaceCharacter_1 + 0x10);
      QRegularExpressionMatch::captured((int)local_368);
      QTextCursor::setPosition((int)local_38,MVar3);
      operator+(&local_3c8,"\n",(QString *)local_318);
      QString::number((uint)&local_3e0,uVar4 + 1);
      operator+(&local_3b0,&local_3c8,&local_3e0);
      operator+(&local_398,&local_3b0,(QString *)&whitespaceCharacter_1.d.size);
      operator+(&local_380,&local_398,(QString *)local_368);
      QTextCursor::insertText((QString *)local_38);
      QString::~QString(&local_380);
      QString::~QString(&local_398);
      QString::~QString(&local_3b0);
      QString::~QString(&local_3e0);
      QString::~QString(&local_3c8);
      QPlainTextEdit::ensureCursorVisible();
      this_local._7_1_ = true;
      local_a0 = 1;
      QString::~QString((QString *)local_368);
      QString::~QString((QString *)&whitespaceCharacter_1.d.size);
      QString::~QString((QString *)local_318);
      QRegularExpressionMatch::~QRegularExpressionMatch
                ((QRegularExpressionMatch *)&whitespaces_1.d.size);
    }
  }
  else {
    QString::QString(&local_178,"^(\\s*)([+|\\-|\\*] \\[(x| |)\\]|[+\\-\\*])(\\s+)");
    QFlags<QRegularExpression::PatternOption>::QFlags(&local_17c,NoPatternOption);
    QRegularExpression::QRegularExpression
              (&local_160,(QString *)&local_178,(QFlags_conflict1 *)(ulong)local_17c.i);
    QRegularExpression::operator=(&local_70,&local_160);
    QRegularExpression::~QRegularExpression(&local_160);
    QString::~QString(&local_178);
    QFlags<QRegularExpression::MatchOption>::QFlags(&local_18c,NoMatchOption);
    QRegularExpression::globalMatch
              ((QString *)local_188,(longlong)&local_70,(MatchType)&regex,(QFlags_conflict1 *)0x0);
    QRegularExpressionMatchIterator::operator=(local_98,local_188);
    QRegularExpressionMatchIterator::~QRegularExpressionMatchIterator(local_188);
    bVar1 = QRegularExpressionMatchIterator::hasNext();
    if ((bVar1 & 1) == 0) goto LAB_001168de;
    QRegularExpressionMatchIterator::next();
    QRegularExpressionMatch::captured((int)&listCharacter + 0x10);
    QRegularExpressionMatch::captured((int)&whitespaceCharacter + 0x10);
    QRegularExpressionMatch::captured((int)local_1e0);
    QString::QString(&local_208,"^([+|\\-|\\*]) \\[(x| |)\\]");
    QFlags<QRegularExpression::PatternOption>::QFlags(&local_20c,NoPatternOption);
    QRegularExpression::QRegularExpression
              (&local_1f0,(QString *)&local_208,(QFlags_conflict1 *)(ulong)local_20c.i);
    QFlags<QRegularExpression::MatchOption>::QFlags
              ((QFlags<QRegularExpression::MatchOption> *)&match_1,NoMatchOption);
    QRegularExpression::globalMatch
              ((QString *)local_1e8,(longlong)&local_1f0,(int)&whitespaceCharacter + 0x10,
               (QFlags_conflict1 *)0x0);
    QRegularExpressionMatchIterator::operator=(local_98,local_1e8);
    QRegularExpressionMatchIterator::~QRegularExpressionMatchIterator(local_1e8);
    QRegularExpression::~QRegularExpression(&local_1f0);
    QString::~QString(&local_208);
    bVar1 = QRegularExpressionMatchIterator::hasNext();
    if ((bVar1 & 1) != 0) {
      QRegularExpressionMatchIterator::next();
      QRegularExpressionMatch::captured((int)local_230);
      QArrayDataPointer<char16_t>::QArrayDataPointer(&local_278,(Data *)0x0,L" [ ]",4);
      QString::QString(&local_260,&local_278);
      operator+(&local_248,(QString *)local_230,&local_260);
      QString::operator=((QString *)&whitespaceCharacter.d.size,(QString *)&local_248);
      QString::~QString(&local_248);
      QString::~QString(&local_260);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_278);
      QString::~QString((QString *)local_230);
      QRegularExpressionMatch::~QRegularExpressionMatch
                ((QRegularExpressionMatch *)&realListCharacter.d.size);
    }
    QTextCursor::setPosition((int)local_38,MVar3);
    operator+(&local_2c0,"\n",(QString *)&listCharacter.d.size);
    operator+(&local_2a8,&local_2c0,(QString *)&whitespaceCharacter.d.size);
    operator+(&local_290,&local_2a8,(QString *)local_1e0);
    QTextCursor::insertText((QString *)local_38);
    QString::~QString(&local_290);
    QString::~QString(&local_2a8);
    QString::~QString(&local_2c0);
    QPlainTextEdit::ensureCursorVisible();
    this_local._7_1_ = true;
    local_a0 = 1;
    QString::~QString((QString *)local_1e0);
    QString::~QString((QString *)&whitespaceCharacter.d.size);
    QString::~QString((QString *)&listCharacter.d.size);
    QRegularExpressionMatch::~QRegularExpressionMatch
              ((QRegularExpressionMatch *)&whitespaces.d.size);
  }
  QString::~QString((QString *)local_130);
LAB_00116f42:
  QRegularExpressionMatchIterator::~QRegularExpressionMatchIterator(local_98);
  QRegularExpression::~QRegularExpression(&local_70);
  QString::~QString((QString *)&regex);
  QTextCursor::~QTextCursor(local_38);
  return this_local._7_1_;
}

Assistant:

bool QMarkdownTextEdit::handleReturnEntered() {
    if (isReadOnly()) {
        return true;
    }

    QTextCursor cursor = this->textCursor();
    const int position = cursor.position();

    cursor.movePosition(QTextCursor::StartOfBlock, QTextCursor::KeepAnchor);
    const QString currentLineText = cursor.selectedText();

    // if return is pressed and there is just an unordered list symbol then we
    // want to remove the list symbol Valid listCharacters: '+ ', '-' , '* ', '+
    // [ ] ', '+ [x] ', '- [ ] ', '- [x] ', '* [ ] ', '* [x] '.
    QRegularExpression regex(R"(^(\s*)([+|\-|\*] \[(x| |)\]|[+\-\*])(\s+)$)");
    QRegularExpressionMatchIterator iterator =
        regex.globalMatch(currentLineText);
    if (iterator.hasNext()) {
        cursor.removeSelectedText();
        return true;
    }

    // if return is pressed and there is just an ordered list symbol then we
    // want to remove the list symbol
    regex = QRegularExpression(R"(^(\s*)(\d+[\.|\)])(\s+)$)");
    iterator = regex.globalMatch(currentLineText);
    if (iterator.hasNext()) {
        qDebug() << cursor.selectedText();
        cursor.removeSelectedText();
        return true;
    }

    // Check if we are in an unordered list.
    // We are in a list when we have '* ', '- ' or '+ ', possibly with preceding
    // whitespace. If e.g. user has entered '**text**' and pressed enter - we
    // don't want do anymore list-stuff.
    QString currentLine = currentLineText.trimmed();
    QChar char0;
    QChar char1;
    if (currentLine.length() >= 1)
        char0 = currentLine.at(0);
    if (currentLine.length() >= 2)
        char1 = currentLine.at(1);
    const bool inList =
        ((char0 == QLatin1Char('*') || char0 == QLatin1Char('-') ||
          char0 == QLatin1Char('+')) &&
         char1 == QLatin1Char(' '));

    if (inList) {
        // if the current line starts with a list character (possibly after
        // whitespaces) add the whitespaces at the next line too
        // Valid listCharacters: '+ ', '-' , '* ', '+ [ ] ', '+ [x] ', '- [ ] ',
        // '- [x] ', '* [ ] ', '* [x] '.
        regex =
            QRegularExpression(R"(^(\s*)([+|\-|\*] \[(x| |)\]|[+\-\*])(\s+))");
        iterator = regex.globalMatch(currentLineText);
        if (iterator.hasNext()) {
            const QRegularExpressionMatch match = iterator.next();
            const QString whitespaces = match.captured(1);
            QString listCharacter = match.captured(2);
            const QString whitespaceCharacter = match.captured(4);

            // start new checkbox list item with an unchecked checkbox
            iterator = QRegularExpression(R"(^([+|\-|\*]) \[(x| |)\])")
                           .globalMatch(listCharacter);
            if (iterator.hasNext()) {
                const QRegularExpressionMatch match = iterator.next();
                const QString realListCharacter = match.captured(1);
                listCharacter = realListCharacter + QStringLiteral(" [ ]");
            }

            cursor.setPosition(position);
            cursor.insertText("\n" + whitespaces + listCharacter +
                              whitespaceCharacter);

            // scroll to the cursor if we are at the bottom of the document
            ensureCursorVisible();
            return true;
        }
    }

    // check for ordered lists and increment the list number in the next line
    regex = QRegularExpression(R"(^(\s*)(\d+)([\.|\)])(\s+))");
    iterator = regex.globalMatch(currentLineText);
    if (iterator.hasNext()) {
        const QRegularExpressionMatch match = iterator.next();
        const QString whitespaces = match.captured(1);
        const uint listNumber = match.captured(2).toUInt();
        const QString listMarker = match.captured(3);
        const QString whitespaceCharacter = match.captured(4);

        cursor.setPosition(position);
        cursor.insertText("\n" + whitespaces + QString::number(listNumber + 1) +
                          listMarker + whitespaceCharacter);

        // scroll to the cursor if we are at the bottom of the document
        ensureCursorVisible();
        return true;
    }

    // intent next line with same whitespaces as in current line
    regex = QRegularExpression(R"(^(\s+))");
    iterator = regex.globalMatch(currentLineText);
    if (iterator.hasNext()) {
        const QRegularExpressionMatch match = iterator.next();
        const QString whitespaces = match.captured(1);

        cursor.setPosition(position);
        cursor.insertText("\n" + whitespaces);

        // scroll to the cursor if we are at the bottom of the document
        ensureCursorVisible();
        return true;
    }

    return false;
}